

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGCompareNameClasses
              (xmlRelaxNGDefinePtr_conflict def1,xmlRelaxNGDefinePtr_conflict def2)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  undefined1 local_190 [8];
  xmlRelaxNGValidCtxt ctxt;
  xmlNs ns;
  xmlNode node;
  int ret;
  xmlRelaxNGDefinePtr_conflict def2_local;
  xmlRelaxNGDefinePtr_conflict def1_local;
  
  memset(local_190,0,0xc0);
  ctxt.doc._0_4_ = 9;
  if ((def1->type == XML_RELAXNG_ELEMENT) || (def1->type == XML_RELAXNG_ATTRIBUTE)) {
    if (def2->type == XML_RELAXNG_TEXT) {
      return 1;
    }
    if ((def1->ns != (xmlChar *)0x0) && (*def1->ns != '\0')) {
      ns._8_8_ = def1->ns;
    }
    iVar2 = xmlRelaxNGElementMatch((xmlRelaxNGValidCtxtPtr)local_190,def2,(xmlNodePtr)&ns.context);
    if (iVar2 == 0) {
      node._116_4_ = 1;
    }
    else if (def1->nameClass == (xmlRelaxNGDefinePtr)0x0) {
      node._116_4_ = 0;
    }
    else {
      node._116_4_ = xmlRelaxNGCompareNameClasses(def1->nameClass,def2);
    }
  }
  else {
    if (def1->type == XML_RELAXNG_TEXT) {
      if (def2->type == XML_RELAXNG_TEXT) {
        return 0;
      }
      return 1;
    }
    if (def1->type == XML_RELAXNG_EXCEPT) {
      node._116_4_ = xmlRelaxNGCompareNameClasses(def1->content,def2);
      if (node._116_4_ == 0) {
        node._116_4_ = 1;
      }
      else if (node._116_4_ == 1) {
        node._116_4_ = 0;
      }
    }
    else {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/relaxng.c"
                ,0xf0b);
      node._116_4_ = 0;
    }
  }
  if (node._116_4_ == 0) {
    def1_local._4_4_ = node._116_4_;
  }
  else {
    if ((def2->type == XML_RELAXNG_ELEMENT) || (def2->type == XML_RELAXNG_ATTRIBUTE)) {
      if (def2->ns == (xmlChar *)0x0) {
        ns._8_8_ = invalidName;
      }
      else if (*def2->ns != '\0') {
        ns._8_8_ = def2->ns;
      }
      iVar2 = xmlRelaxNGElementMatch((xmlRelaxNGValidCtxtPtr)local_190,def1,(xmlNodePtr)&ns.context)
      ;
      if (iVar2 == 0) {
        node._116_4_ = 1;
      }
      else if (def2->nameClass == (xmlRelaxNGDefinePtr)0x0) {
        node._116_4_ = 0;
      }
      else {
        node._116_4_ = xmlRelaxNGCompareNameClasses(def2->nameClass,def1);
      }
    }
    else {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/relaxng.c"
                ,0xf2a);
      node._116_4_ = 0;
    }
    def1_local._4_4_ = node._116_4_;
  }
  return def1_local._4_4_;
}

Assistant:

static int
xmlRelaxNGCompareNameClasses(xmlRelaxNGDefinePtr def1,
                             xmlRelaxNGDefinePtr def2)
{
    int ret = 1;
    xmlNode node;
    xmlNs ns;
    xmlRelaxNGValidCtxt ctxt;

    memset(&ctxt, 0, sizeof(xmlRelaxNGValidCtxt));

    ctxt.flags = FLAGS_IGNORABLE | FLAGS_NOERROR;

    if ((def1->type == XML_RELAXNG_ELEMENT) ||
        (def1->type == XML_RELAXNG_ATTRIBUTE)) {
        if (def2->type == XML_RELAXNG_TEXT)
            return (1);
        if (def1->name != NULL) {
            node.name = def1->name;
        } else {
            node.name = invalidName;
        }
        if (def1->ns != NULL) {
            if (def1->ns[0] == 0) {
                node.ns = NULL;
            } else {
	        node.ns = &ns;
                ns.href = def1->ns;
            }
        } else {
            node.ns = NULL;
        }
        if (xmlRelaxNGElementMatch(&ctxt, def2, &node)) {
            if (def1->nameClass != NULL) {
                ret = xmlRelaxNGCompareNameClasses(def1->nameClass, def2);
            } else {
                ret = 0;
            }
        } else {
            ret = 1;
        }
    } else if (def1->type == XML_RELAXNG_TEXT) {
        if (def2->type == XML_RELAXNG_TEXT)
            return (0);
        return (1);
    } else if (def1->type == XML_RELAXNG_EXCEPT) {
        ret = xmlRelaxNGCompareNameClasses(def1->content, def2);
	if (ret == 0)
	    ret = 1;
	else if (ret == 1)
	    ret = 0;
    } else {
        TODO ret = 0;
    }
    if (ret == 0)
        return (ret);
    if ((def2->type == XML_RELAXNG_ELEMENT) ||
        (def2->type == XML_RELAXNG_ATTRIBUTE)) {
        if (def2->name != NULL) {
            node.name = def2->name;
        } else {
            node.name = invalidName;
        }
        node.ns = &ns;
        if (def2->ns != NULL) {
            if (def2->ns[0] == 0) {
                node.ns = NULL;
            } else {
                ns.href = def2->ns;
            }
        } else {
            ns.href = invalidName;
        }
        if (xmlRelaxNGElementMatch(&ctxt, def1, &node)) {
            if (def2->nameClass != NULL) {
                ret = xmlRelaxNGCompareNameClasses(def2->nameClass, def1);
            } else {
                ret = 0;
            }
        } else {
            ret = 1;
        }
    } else {
        TODO ret = 0;
    }

    return (ret);
}